

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

qint64 QDataStream::readQSizeType(QDataStream *s)

{
  int iVar1;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qint64 extendedLen;
  quint32 first;
  quint32 *in_stack_ffffffffffffffc8;
  QDataStream *in_stack_ffffffffffffffd0;
  undefined1 *local_20;
  undefined1 *local_18;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0xaaaaaaaa;
  operator>>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (local_c == 0xffffffff) {
    local_20 = (undefined1 *)0xffffffffffffffff;
  }
  else {
    if (0xfffffffd < local_c) {
      iVar1 = version(in_RDI);
      if (0x15 < iVar1) {
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        QDataStream::operator>>(in_RDI,(longlong *)&local_18);
        local_20 = local_18;
        goto LAB_00506fad;
      }
    }
    local_20 = (undefined1 *)(ulong)local_c;
  }
LAB_00506fad:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (qint64)local_20;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QDataStream::readQSizeType(QDataStream &s)
{
    quint32 first;
    s >> first;
    if (first == NullCode)
        return -1;
    if (first < ExtendedSize || s.version() < QDataStream::Qt_6_7)
        return qint64(first);
    qint64 extendedLen;
    s >> extendedLen;
    return extendedLen;
}